

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

int __thiscall cmComputeLinkDepends::AddLinkEntry(cmComputeLinkDepends *this,cmLinkItem *item)

{
  iterator *piVar1;
  pointer pLVar2;
  _Elt_pointer pBVar3;
  _Alloc_hider _Var4;
  int iVar5;
  iterator iVar6;
  iterator iVar7;
  long lVar8;
  cmTarget *pcVar9;
  char *pcVar10;
  DependSetList *pDVar11;
  _Rb_tree_color _Var12;
  pointer pLVar13;
  BFSEntry qe;
  BFSEntry qe_1;
  string local_68;
  long local_48;
  BFSEntry local_40;
  
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->LinkEntryIndex)._M_t,&item->super_string);
  if ((_Rb_tree_header *)iVar6._M_node == &(this->LinkEntryIndex)._M_t._M_impl.super__Rb_tree_header
     ) {
    iVar7 = AllocateLinkEntry(this,&item->super_string);
    _Var12 = iVar7._M_node[2]._M_color;
    lVar8 = (long)(int)_Var12;
    pLVar2 = (this->EntryList).
             super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar13 = pLVar2 + lVar8;
    local_48 = lVar8;
    std::__cxx11::string::_M_assign((string *)pLVar13);
    pcVar9 = item->Target;
    pLVar2[lVar8].Target = pcVar9;
    if (((pcVar9 == (cmTarget *)0x0) &&
        (pcVar10 = (item->super_string)._M_dataplus._M_p, *pcVar10 == '-')) && (pcVar10[1] != 'l'))
    {
      std::__cxx11::string::substr((ulong)&local_68,(ulong)item);
      iVar5 = std::__cxx11::string::compare((char *)&local_68);
      pLVar13->IsFlag = iVar5 != 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      pcVar9 = pLVar13->Target;
    }
    else {
      pLVar13->IsFlag = false;
    }
    if (pcVar9 == (cmTarget *)0x0) {
      _Var4._M_p = (pLVar13->Item)._M_dataplus._M_p;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,_Var4._M_p,_Var4._M_p + (pLVar13->Item)._M_string_length);
      std::__cxx11::string::append((char *)&local_68);
      pcVar10 = cmMakefile::GetDefinition(this->Makefile,&local_68);
      if (pcVar10 == (char *)0x0) {
        if (pLVar13->IsFlag == false) {
          pDVar11 = (DependSetList *)operator_new(0x18);
          *(undefined8 *)
           &(pDVar11->
            super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
            ).
            super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
            ._M_impl = 0;
          *(pointer *)
           ((long)&(pDVar11->
                   super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                   ).
                   super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                   ._M_impl + 8) = (pointer)0x0;
          *(pointer *)
           ((long)&(pDVar11->
                   super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                   ).
                   super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                   ._M_impl + 0x10) = (pointer)0x0;
          (this->InferredDependSets).
          super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
          ._M_impl.super__Vector_impl_data._M_start[local_48] = pDVar11;
        }
      }
      else {
        pBVar3 = (this->BFSQueue).c.
                 super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        local_40.Index = _Var12;
        local_40.LibDepends = pcVar10;
        if (pBVar3 == (this->BFSQueue).c.
                      super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>
          ::_M_push_back_aux<cmComputeLinkDepends::BFSEntry_const&>
                    ((deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>
                      *)&this->BFSQueue,&local_40);
        }
        else {
          *(ulong *)pBVar3 = CONCAT44(local_40._4_4_,_Var12);
          pBVar3->LibDepends = pcVar10;
          piVar1 = &(this->BFSQueue).c.
                    super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_68._M_dataplus._M_p._0_4_ = _Var12;
      local_68._M_string_length = 0;
      pBVar3 = (this->BFSQueue).c.
               super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pBVar3 == (this->BFSQueue).c.
                    super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>::
        _M_push_back_aux<cmComputeLinkDepends::BFSEntry_const&>
                  ((deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>
                    *)&this->BFSQueue,(BFSEntry *)&local_68);
      }
      else {
        *(pointer *)pBVar3 = local_68._M_dataplus._M_p;
        pBVar3->LibDepends = (char *)0x0;
        piVar1 = &(this->BFSQueue).c.
                  super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                  ._M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
    }
  }
  else {
    _Var12 = iVar6._M_node[2]._M_color;
  }
  return _Var12;
}

Assistant:

int cmComputeLinkDepends::AddLinkEntry(cmLinkItem const& item)
{
  // Check if the item entry has already been added.
  std::map<std::string, int>::iterator lei = this->LinkEntryIndex.find(item);
  if(lei != this->LinkEntryIndex.end())
    {
    // Yes.  We do not need to follow the item's dependencies again.
    return lei->second;
    }

  // Allocate a spot for the item entry.
  lei = this->AllocateLinkEntry(item);

  // Initialize the item entry.
  int index = lei->second;
  LinkEntry& entry = this->EntryList[index];
  entry.Item = item;
  entry.Target = item.Target;
  entry.IsFlag = (!entry.Target && item[0] == '-' && item[1] != 'l' &&
                  item.substr(0, 10) != "-framework");

  // If the item has dependencies queue it to follow them.
  if(entry.Target)
    {
    // Target dependencies are always known.  Follow them.
    BFSEntry qe = {index, 0};
    this->BFSQueue.push(qe);
    }
  else
    {
    // Look for an old-style <item>_LIB_DEPENDS variable.
    std::string var = entry.Item;
    var += "_LIB_DEPENDS";
    if(const char* val = this->Makefile->GetDefinition(var))
      {
      // The item dependencies are known.  Follow them.
      BFSEntry qe = {index, val};
      this->BFSQueue.push(qe);
      }
    else if(!entry.IsFlag)
      {
      // The item dependencies are not known.  We need to infer them.
      this->InferredDependSets[index] = new DependSetList;
      }
    }

  return index;
}